

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_bounding_sphere(REF_NODE ref_node,REF_INT *nodes,REF_INT n,REF_DBL *center,REF_DBL *radius)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_DBL local_58;
  int local_38;
  int local_34;
  REF_INT j;
  REF_INT i;
  REF_DBL *radius_local;
  REF_DBL *center_local;
  REF_INT n_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    center[local_34] = 0.0;
    for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
      center[local_34] = ref_node->real[local_34 + nodes[local_38] * 0xf] + center[local_34];
    }
    center[local_34] = center[local_34] / (double)n;
  }
  *radius = 0.0;
  for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
    dVar4 = *radius;
    dVar1 = pow(ref_node->real[nodes[local_34] * 0xf] - *center,2.0);
    dVar2 = pow(ref_node->real[nodes[local_34] * 0xf + 1] - center[1],2.0);
    dVar3 = pow(ref_node->real[nodes[local_34] * 0xf + 2] - center[2],2.0);
    dVar1 = sqrt(dVar1 + dVar2 + dVar3);
    if (dVar4 <= dVar1) {
      dVar4 = pow(ref_node->real[nodes[local_34] * 0xf] - *center,2.0);
      dVar1 = pow(ref_node->real[nodes[local_34] * 0xf + 1] - center[1],2.0);
      dVar2 = pow(ref_node->real[nodes[local_34] * 0xf + 2] - center[2],2.0);
      local_58 = sqrt(dVar4 + dVar1 + dVar2);
    }
    else {
      local_58 = *radius;
    }
    *radius = local_58;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_sphere(REF_NODE ref_node, REF_INT *nodes,
                                            REF_INT n, REF_DBL *center,
                                            REF_DBL *radius) {
  REF_INT i, j;
  for (i = 0; i < 3; i++) {
    center[i] = 0;
    for (j = 0; j < n; j++) {
      center[i] += ref_node_xyz(ref_node, i, nodes[j]);
    }
    center[i] /= (REF_DBL)n;
  }
  *radius = 0.0;
  for (i = 0; i < n; i++)
    *radius = MAX(
        *radius, sqrt(pow(ref_node_xyz(ref_node, 0, nodes[i]) - center[0], 2) +
                      pow(ref_node_xyz(ref_node, 1, nodes[i]) - center[1], 2) +
                      pow(ref_node_xyz(ref_node, 2, nodes[i]) - center[2], 2)));
  return REF_SUCCESS;
}